

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_example.cpp
# Opt level: O2

int main(void)

{
  pointer pNVar1;
  pointer pNVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  pointer pPVar10;
  Index<32UL,_4UL> IVar11;
  uint uVar12;
  SmallStack<bvh::v2::Index<32UL,_4UL>,_64U> *pSVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ostream *poVar17;
  ulong uVar18;
  long lVar19;
  _Map_pointer ppfVar20;
  long lVar21;
  size_t j;
  _Elt_pointer pfVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_madmann91[P]bvh_src_bvh_v2_sweep_sah_builder_h:60:71)>
  __comp;
  float t1;
  Vec<float,_3UL> v_1;
  undefined1 local_3f4 [12];
  tuple<float,_float,_float> local_3e8;
  undefined1 uStack_3dc;
  undefined3 uStack_3db;
  vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
  mini_trees;
  float fStack_3c0;
  undefined1 local_3bc [12];
  MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int> builder;
  vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> tris;
  _Map_pointer local_358;
  undefined4 local_350;
  Scalar v;
  Scalar u;
  undefined1 local_340 [40];
  _Elt_pointer local_318;
  anon_class_24_3_9fa53d14 local_310;
  vector<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_>
  precomputed_tris;
  Index<32UL,_4UL> local_2dc;
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> bvh;
  vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> centers;
  vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_> bboxes;
  SmallStack<bvh::v2::Index<32UL,_4UL>,_64U> stack;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined4 local_158;
  Index<32UL,_4UL> local_154;
  undefined8 local_150;
  undefined8 local_148;
  int local_140;
  undefined8 local_138;
  ThreadPool thread_pool;
  
  auVar24._8_4_ = 0x3f800000;
  auVar24._0_8_ = 0x3f8000003f800000;
  auVar24._12_4_ = 0x3f800000;
  tris.super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tris.super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tris.super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  stack.elems[0].value = 0x3f800000;
  stack.elems[1].value = 0xbf800000;
  stack.elems[2].value = 0x3f800000;
  thread_pool._0_8_ = vmovlps_avx(auVar24);
  thread_pool.mutex_.super___mutex_base._M_mutex.__data.__lock = 0x3f800000;
  builder.executor_.thread_pool = (ThreadPool *)0x3f800000bf800000;
  builder.executor_.parallel_threshold =
       CONCAT44(builder.executor_.parallel_threshold._4_4_,0x3f800000);
  std::vector<bvh::v2::Tri<float,3ul>,std::allocator<bvh::v2::Tri<float,3ul>>>::
  emplace_back<bvh::v2::Vec<float,3ul>,bvh::v2::Vec<float,3ul>,bvh::v2::Vec<float,3ul>>
            ((vector<bvh::v2::Tri<float,3ul>,std::allocator<bvh::v2::Tri<float,3ul>>> *)&tris,
             (Vec<float,_3UL> *)&stack,(Vec<float,_3UL> *)&thread_pool,(Vec<float,_3UL> *)&builder);
  auVar32._8_4_ = 0xbf800000;
  auVar32._0_8_ = 0xbf800000bf800000;
  auVar32._12_4_ = 0xbf800000;
  stack.elems[0].value = 0x3f800000;
  stack.elems[1].value = 0xbf800000;
  builder.executor_.thread_pool = (ThreadPool *)0x3f800000bf800000;
  stack.elems[2].value = 0x3f800000;
  builder.executor_.parallel_threshold =
       CONCAT44(builder.executor_.parallel_threshold._4_4_,0x3f800000);
  thread_pool._0_8_ = vmovlps_avx(auVar32);
  thread_pool.mutex_.super___mutex_base._M_mutex.__data.__lock = 0x3f800000;
  std::vector<bvh::v2::Tri<float,3ul>,std::allocator<bvh::v2::Tri<float,3ul>>>::
  emplace_back<bvh::v2::Vec<float,3ul>,bvh::v2::Vec<float,3ul>,bvh::v2::Vec<float,3ul>>
            ((vector<bvh::v2::Tri<float,3ul>,std::allocator<bvh::v2::Tri<float,3ul>>> *)&tris,
             (Vec<float,_3UL> *)&stack,(Vec<float,_3UL> *)&thread_pool,(Vec<float,_3UL> *)&builder);
  ::bvh::v2::ThreadPool::ThreadPool(&thread_pool,0);
  std::vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>::vector
            (&bboxes,((long)tris.
                            super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)tris.
                           super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x24,
             (allocator_type *)&stack);
  pSVar13 = (SmallStack<bvh::v2::Index<32UL,_4UL>,_64U> *)
            (((long)tris.
                    super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)tris.
                   super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x24);
  std::vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>::vector
            (&centers,(size_type)pSVar13,(allocator_type *)&stack);
  uVar14 = ((long)tris.
                  super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)tris.
                 super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x24;
  local_310.bboxes = &bboxes;
  local_310.tris = &tris;
  local_310.centers = &centers;
  if (uVar14 < 0x400) {
    main::anon_class_24_3_9fa53d14::operator()(&local_310,0,uVar14);
  }
  else {
    uVar16 = uVar14 / (ulong)((long)thread_pool.threads_.
                                    super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)thread_pool.threads_.
                                    super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3);
    uVar15 = 0;
    while (uVar15 < uVar14) {
      stack.elems[0].value = 0;
      stack.elems[1].value = 0;
      stack.elems[2].value = 0;
      stack.elems[3].value = 0;
      stack.elems[4].value = 0;
      stack.elems[5].value = 0;
      stack.elems[6].value = 0;
      stack.elems[7].value = 0;
      stack.elems._0_8_ = operator_new(0x28);
      uVar3 = uVar15 + uVar16 + (uVar16 == 0);
      uVar18 = uVar14;
      if (uVar3 < uVar14) {
        uVar18 = uVar3;
      }
      *(vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> **)
       (stack.elems._0_8_ + 0x10) = local_310.centers;
      *(vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_> **)
       stack.elems._0_8_ = local_310.bboxes;
      *(vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> **)
       (stack.elems._0_8_ + 8) = local_310.tris;
      *(ulong *)(stack.elems._0_8_ + 0x18) = uVar15;
      *(ulong *)(stack.elems._0_8_ + 0x20) = uVar18;
      stack.elems._24_8_ =
           std::
           _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/executor.h:58:30)>
           ::_M_invoke;
      stack.elems._16_8_ =
           std::
           _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/executor.h:58:30)>
           ::_M_manager;
      pSVar13 = &stack;
      ::bvh::v2::ThreadPool::push(&thread_pool,(Task *)&stack);
      std::_Function_base::~_Function_base((_Function_base *)&stack);
      uVar15 = uVar3;
    }
    ::bvh::v2::ThreadPool::wait(&thread_pool,pSVar13);
  }
  builder.executor_.thread_pool = &thread_pool;
  local_168 = 0;
  uStack_160 = 0;
  local_158 = 0x3f800000;
  local_150 = 1;
  local_148 = 8;
  local_138 = 0x400;
  local_140 = 2;
  uVar14 = ((long)bboxes.
                  super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)bboxes.
                 super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  uVar15 = ((long)centers.
                  super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)centers.
                 super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0xc;
  if (uVar14 < 0x400) {
    builder.executor_.thread_pool =
         (ThreadPool *)
         centers.
         super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>.
         _M_impl.super__Vector_impl_data._M_start;
    stack.elems._0_8_ = &PTR___cxa_pure_virtual_00118cf8;
    stack.elems._40_8_ = &local_168;
    stack.elems._8_8_ =
         bboxes.
         super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>.
         _M_impl.super__Vector_impl_data._M_start;
    stack.elems._24_8_ =
         centers.
         super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>.
         _M_impl.super__Vector_impl_data._M_start;
    builder.executor_.parallel_threshold = uVar15;
    stack.elems._16_8_ = uVar14;
    stack.elems._32_8_ = uVar15;
    if (uVar14 != uVar15) {
      __assert_fail("bboxes.size() == centers.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/top_down_sah_builder.h"
                    ,0x3f,
                    "bvh::v2::TopDownSahBuilder<bvh::v2::Node<float, 3>>::TopDownSahBuilder(std::span<const BBox>, std::span<const Vec>, const Config &) [Node = bvh::v2::Node<float, 3>]"
                   );
    }
    stack.elems._0_8_ = &PTR_get_prim_ids_00118d18;
    stack.elems[0xc].value = 0;
    stack.elems[0xd].value = 0;
    stack.elems._56_8_ = (ulong)stack.elems[0xf].value << 0x20;
    stack.elems[0x10].value = 0;
    stack.elems[0x11].value = 0;
    stack.elems[0x12].value = 0;
    stack.elems._80_40_ = SUB6440(ZEXT464(0) << 0x40,0);
    stack.elems._120_24_ = SUB6424(ZEXT464(0) << 0x40,0);
    stack.elems[0x24].value = 0;
    stack.elems[0x25].value = 0;
    stack.elems[0x26].value = 0;
    stack.elems[0x27].value = 0;
    stack.elems[0x28].value = 0;
    stack.elems[0x29].value = 0;
    stack.elems[0x2a].value = 0;
    stack.elems[0x2b].value = 0;
    stack.elems[0x2c].value = 0;
    stack.elems[0x2d].value = 0;
    std::vector<bool,_std::allocator<bool>_>::resize
              ((vector<bool,_std::allocator<bool>_> *)(stack.elems + 0xc),uVar14,false);
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)(stack.elems + 0x16),uVar14);
    for (mini_trees.
         super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        mini_trees.
        super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start < (pointer)0x3;
        mini_trees.
        super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((long)&((mini_trees.
                                super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->nodes).
                              super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 1)) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 (stack.elems +
                 (long)mini_trees.
                       super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start * 6 + 0x1c),uVar14);
      lVar21 = 0;
      lVar5 = *(long *)(stack.elems +
                       (long)mini_trees.
                             super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start * 6 + 0x1c);
      lVar6 = *(long *)(stack.elems +
                       (long)mini_trees.
                             super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start * 6 + 0x1e);
      for (lVar19 = 0; lVar5 + lVar19 != lVar6; lVar19 = lVar19 + 8) {
        *(long *)(lVar5 + lVar21 * 8) = lVar21;
        lVar21 = lVar21 + 1;
      }
      __comp._M_comp.axis = (size_t *)&mini_trees;
      __comp._M_comp.centers =
           (span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL> *)&builder;
      std::
      __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<bvh::v2::SweepSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::SweepSahBuilder(std::span<bvh::v2::BBox<float,3ul>const,18446744073709551615ul>,std::span<bvh::v2::Vec<float,3ul>const,18446744073709551615ul>,bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::Config_const&)::_lambda(unsigned_long,unsigned_long)_1_>>
                ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )*(unsigned_long **)
                    (stack.elems +
                    (long)mini_trees.
                          super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start * 6 + 0x1c),
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )*(unsigned_long **)
                    (stack.elems +
                    (long)mini_trees.
                          super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start * 6 + 0x1e),__comp);
    }
    ::bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::build
              (&bvh,(TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *)&stack);
    ::bvh::v2::SweepSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::~SweepSahBuilder
              ((SweepSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *)&stack);
    if (local_140 == 2) {
      stack.elems[0].value = 0x3d4ccccd;
      stack.elems[2].value = 3;
      stack.elems[3].value = 0;
      ::bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::optimize
                (&bvh,(Config *)&stack);
    }
  }
  else {
    stack.elems[0].value = 0;
    stack.elems[1].value = 0;
    stack.elems[2].value = 0;
    stack.elems[3].value = 0;
    stack.elems[5].value = local_154.value;
    stack.elems[4].value = 0x3f800000;
    stack.elems[6].value = 1;
    stack.elems[7].value = 0;
    stack.elems[8].value = 8;
    stack.elems[9].value = 0;
    stack.elems[10].value._0_1_ = 1;
    stack.elems[0xb].value = 0x3c23d70a;
    stack.elems[0xc].value = 0x400;
    stack.elems[0xd].value = 0;
    builder.executor_.parallel_threshold = 0x400;
    builder.config_ = (Config *)&stack;
    builder.bboxes_._M_ptr =
         bboxes.
         super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>.
         _M_impl.super__Vector_impl_data._M_start;
    builder.centers_._M_ptr =
         centers.
         super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>.
         _M_impl.super__Vector_impl_data._M_start;
    stack.elems[0xe].value = 4;
    stack.elems[0xf].value = 0;
    builder.bboxes_._M_extent._M_extent_value = uVar14;
    builder.centers_._M_extent._M_extent_value = uVar15;
    if (uVar14 != uVar15) {
      __assert_fail("bboxes.size() == centers.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/mini_tree_builder.h"
                    ,0x9d,
                    "bvh::v2::MiniTreeBuilder<bvh::v2::Node<float, 3>>::MiniTreeBuilder(ThreadPool &, std::span<const BBox>, std::span<const Vec>, const Config &) [Node = bvh::v2::Node<float, 3>, MortonCode = unsigned int]"
                   );
    }
    ::bvh::v2::MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int>::build_mini_trees
              (&mini_trees,&builder);
    if ((char)stack.elems[10].value == '\x01') {
      ::bvh::v2::MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int>::
      prune_mini_trees((vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                        *)&precomputed_tris,&builder,&mini_trees);
      std::
      vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
      ::_M_move_assign(&mini_trees,
                       (vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                        *)&precomputed_tris);
      std::
      vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
      ::~vector((vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                 *)&precomputed_tris);
    }
    ::bvh::v2::MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int>::build_top_bvh
              (&bvh,&builder,&mini_trees);
    std::
    vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
    ::~vector(&mini_trees);
    if (local_140 == 2) {
      stack.elems[0].value = 0x3d4ccccd;
      stack.elems[2].value = 3;
      stack.elems[3].value = 0;
      ::bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::optimize
                (&thread_pool,&bvh,(Config *)&stack);
    }
  }
  pSVar13 = (SmallStack<bvh::v2::Index<32UL,_4UL>,_64U> *)
            (((long)tris.
                    super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)tris.
                   super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x24);
  std::vector<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_>::
  vector(&precomputed_tris,(size_type)pSVar13,(allocator_type *)&stack);
  local_340._24_8_ = &bvh;
  uVar14 = ((long)tris.
                  super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)tris.
                 super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x24;
  local_340._32_8_ = (_Elt_pointer)&precomputed_tris;
  local_318 = (_Elt_pointer)&tris;
  if (uVar14 < 0x400) {
    main::anon_class_24_3_dbdafb4e::operator()
              ((anon_class_24_3_dbdafb4e *)(local_340 + 0x18),0,uVar14);
  }
  else {
    uVar16 = uVar14 / (ulong)((long)thread_pool.threads_.
                                    super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)thread_pool.threads_.
                                    super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3);
    uVar15 = 0;
    while (uVar15 < uVar14) {
      stack.elems[0].value = 0;
      stack.elems[1].value = 0;
      stack.elems[2].value = 0;
      stack.elems[3].value = 0;
      stack.elems[4].value = 0;
      stack.elems[5].value = 0;
      stack.elems[6].value = 0;
      stack.elems[7].value = 0;
      stack.elems._0_8_ = operator_new(0x28);
      uVar3 = uVar15 + uVar16 + (uVar16 == 0);
      uVar18 = uVar14;
      if (uVar3 < uVar14) {
        uVar18 = uVar3;
      }
      *(_Elt_pointer *)(stack.elems._0_8_ + 0x10) = local_318;
      *(undefined8 *)stack.elems._0_8_ = local_340._24_8_;
      *(undefined8 *)(stack.elems._0_8_ + 8) = local_340._32_8_;
      *(ulong *)(stack.elems._0_8_ + 0x18) = uVar15;
      *(ulong *)(stack.elems._0_8_ + 0x20) = uVar18;
      stack.elems._24_8_ =
           std::
           _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/executor.h:58:30)>
           ::_M_invoke;
      stack.elems._16_8_ =
           std::
           _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/executor.h:58:30)>
           ::_M_manager;
      pSVar13 = &stack;
      ::bvh::v2::ThreadPool::push(&thread_pool,(Task *)&stack);
      std::_Function_base::~_Function_base((_Function_base *)&stack);
      uVar15 = uVar3;
    }
    ::bvh::v2::ThreadPool::wait(&thread_pool,pSVar13);
  }
  mini_trees.
  super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0.0;
  mini_trees.
  super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  mini_trees.
  super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0.0;
  mini_trees.
  super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0.0;
  stack.size = 0;
  unique0x00006b80 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  local_3bc._0_4_ = 100.0;
  local_2dc.value =
       ((bvh.nodes.
         super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->index).value;
  local_3f4._0_4_ = 0;
  ::bvh::v2::SmallStack<bvh::v2::Index<32UL,_4UL>,_64U>::push(&stack,&local_2dc);
  local_340._0_8_ = (_Elt_pointer)0xffffffffffffffff;
LAB_00102afb:
  do {
    if (stack.size == 0) {
      bVar23 = (_Elt_pointer)local_340._0_8_ == (_Elt_pointer)0xffffffffffffffff;
      if (bVar23) {
        poVar17 = std::operator<<((ostream *)&std::cout,"No intersection found");
        std::endl<char,std::char_traits<char>>(poVar17);
      }
      else {
        poVar17 = std::operator<<((ostream *)&std::cout,"Intersection found\n");
        poVar17 = std::operator<<(poVar17,"  primitive: ");
        poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
        poVar17 = std::operator<<(poVar17,"\n");
        poVar17 = std::operator<<(poVar17,"  distance: ");
        poVar17 = (ostream *)std::ostream::operator<<(poVar17,(float)local_3bc._0_4_);
        poVar17 = std::operator<<(poVar17,"\n");
        poVar17 = std::operator<<(poVar17,"  barycentric coords.: ");
        poVar17 = (ostream *)std::ostream::operator<<(poVar17,u);
        poVar17 = std::operator<<(poVar17,", ");
        poVar17 = (ostream *)std::ostream::operator<<(poVar17,v);
        std::endl<char,std::char_traits<char>>(poVar17);
      }
      std::
      _Vector_base<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_>
      ::~_Vector_base(&precomputed_tris.
                       super__Vector_base<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_>
                     );
      ::bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::~Bvh(&bvh);
      std::_Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>::
      ~_Vector_base(&centers.
                     super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                   );
      std::_Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>::
      ~_Vector_base(&bboxes.
                     super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                   );
      ::bvh::v2::ThreadPool::~ThreadPool(&thread_pool);
      std::_Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>::
      ~_Vector_base(&tris.
                     super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                   );
      return (uint)bVar23;
    }
    IVar11 = ::bvh::v2::SmallStack<bvh::v2::Index<32UL,_4UL>,_64U>::pop(&stack);
    while( true ) {
      pNVar2 = bvh.nodes.
               super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pfVar22 = (_Elt_pointer)(ulong)(IVar11.value >> 4);
      if ((IVar11.value & 0xf) != 0) break;
      pNVar1 = bvh.nodes.
               super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start + (long)pfVar22;
      local_350 = *(undefined4 *)
                   ((long)(pNVar1->bounds)._M_elems + (ulong)(local_3f4._0_4_ & 4) + 0x10);
      builder.executor_.thread_pool = (ThreadPool *)&v_1;
      auVar24 = vinsertps_avx(ZEXT416((uint)(pNVar1->bounds)._M_elems[local_3f4._0_4_ & 1]),
                              ZEXT416(*(uint *)((long)(pNVar1->bounds)._M_elems +
                                               (ulong)(local_3f4._0_4_ * 2 & 4) + 8)),0x10);
      builder.executor_.parallel_threshold = (size_t)&local_3e8;
      auVar7._8_4_ = 0x7f7fffff;
      auVar7._0_8_ = 0x7f7fffff7f7fffff;
      auVar7._12_4_ = 0x7f7fffff;
      auVar24 = vmulps_avx512vl(auVar24,auVar7);
      local_358 = (_Map_pointer)vmovlps_avx(auVar24);
      local_3e8.super__Tuple_impl<0UL,_float,_float,_float>.super__Tuple_impl<1UL,_float,_float> =
           (_Tuple_impl<1UL,_float,_float>)pNVar1;
      unique0x10001791 = (__pthread_internal_list *)local_3f4;
      ::bvh::v2::Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:64:38)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)&builder,0);
      ::bvh::v2::Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:64:38)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)&builder,1);
      ::bvh::v2::Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:64:38)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)&builder,2);
      pNVar2 = pNVar2 + (long)&(pfVar22->super__Function_base)._M_functor._M_unused + 1;
      builder.executor_.parallel_threshold = (size_t)&local_358;
      builder.bboxes_._M_ptr = (pointer)&t1;
      auVar28._0_4_ = v_1.values[0] * 3.4028235e+38;
      auVar28._4_4_ = v_1.values[1] * 3.4028235e+38;
      auVar28._8_8_ = 0;
      local_3e8.super__Tuple_impl<0UL,_float,_float,_float>.super__Tuple_impl<1UL,_float,_float> =
           (_Tuple_impl<1UL,_float,_float>)vmovlps_avx(auVar28);
      local_3e8.super__Tuple_impl<0UL,_float,_float,_float>.super__Head_base<0UL,_float,_false>.
      _M_head_impl = v_1.values[2];
      v_1.values[1] = v_1.values[1];
      v_1.values[0] = fStack_3c0;
      t1 = (float)local_3bc._0_4_;
      builder.executor_.thread_pool = (ThreadPool *)&v_1;
      builder.bboxes_._M_extent._M_extent_value = (size_t)&local_3e8;
      ::bvh::v2::Node<float,_3UL,_32UL,_4UL>::make_intersection_result::anon_class_32_4_dce2b386::
      operator()((anon_class_32_4_dce2b386 *)&builder,0);
      ::bvh::v2::Node<float,_3UL,_32UL,_4UL>::make_intersection_result::anon_class_32_4_dce2b386::
      operator()((anon_class_32_4_dce2b386 *)&builder,1);
      ::bvh::v2::Node<float,_3UL,_32UL,_4UL>::make_intersection_result::anon_class_32_4_dce2b386::
      operator()((anon_class_32_4_dce2b386 *)&builder,2);
      fVar26 = v_1.values[0];
      local_350 = *(undefined4 *)
                   ((long)(pNVar2->bounds)._M_elems + (ulong)(local_3f4._0_4_ & 4) + 0x10);
      local_3f4._4_4_ = t1;
      auVar24 = vinsertps_avx(ZEXT416((uint)(pNVar2->bounds)._M_elems[local_3f4._0_4_ & 1]),
                              ZEXT416(*(uint *)((long)(pNVar2->bounds)._M_elems +
                                               (ulong)(local_3f4._0_4_ * 2 & 4) + 8)),0x10);
      auVar8._8_4_ = 0x7f7fffff;
      auVar8._0_8_ = 0x7f7fffff7f7fffff;
      auVar8._12_4_ = 0x7f7fffff;
      auVar24 = vmulps_avx512vl(auVar24,auVar8);
      local_358 = (_Map_pointer)vmovlps_avx(auVar24);
      local_3e8.super__Tuple_impl<0UL,_float,_float,_float>.super__Tuple_impl<1UL,_float,_float> =
           (_Tuple_impl<1UL,_float,_float>)pNVar2;
      unique0x10001799 = (__pthread_internal_list *)local_3f4;
      builder.executor_.thread_pool = (ThreadPool *)&v_1;
      builder.executor_.parallel_threshold = (size_t)&local_3e8;
      ::bvh::v2::Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:64:38)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)&builder,0);
      ::bvh::v2::Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:64:38)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)&builder,1);
      ::bvh::v2::Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:64:38)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)&builder,2);
      auVar29._8_8_ = 0;
      auVar29._0_4_ = v_1.values[0];
      auVar29._4_4_ = v_1.values[1];
      builder.executor_.thread_pool = (ThreadPool *)&v_1;
      auVar9._8_4_ = 0x7f7fffff;
      auVar9._0_8_ = 0x7f7fffff7f7fffff;
      auVar9._12_4_ = 0x7f7fffff;
      auVar24 = vmulps_avx512vl(auVar29,auVar9);
      builder.executor_.parallel_threshold = (size_t)&local_358;
      builder.bboxes_._M_ptr = (pointer)&t1;
      builder.bboxes_._M_extent._M_extent_value = (size_t)&local_3e8;
      v_1.values[0] = fStack_3c0;
      local_3e8.super__Tuple_impl<0UL,_float,_float,_float>.super__Tuple_impl<1UL,_float,_float> =
           (_Tuple_impl<1UL,_float,_float>)vmovlps_avx(auVar24);
      local_3e8.super__Tuple_impl<0UL,_float,_float,_float>.super__Head_base<0UL,_float,_false>.
      _M_head_impl = v_1.values[2];
      t1 = (float)local_3bc._0_4_;
      ::bvh::v2::Node<float,_3UL,_32UL,_4UL>::make_intersection_result::anon_class_32_4_dce2b386::
      operator()((anon_class_32_4_dce2b386 *)&builder,0);
      ::bvh::v2::Node<float,_3UL,_32UL,_4UL>::make_intersection_result::anon_class_32_4_dce2b386::
      operator()((anon_class_32_4_dce2b386 *)&builder,1);
      ::bvh::v2::Node<float,_3UL,_32UL,_4UL>::make_intersection_result::anon_class_32_4_dce2b386::
      operator()((anon_class_32_4_dce2b386 *)&builder,2);
      if (fVar26 <= (float)local_3f4._4_4_) {
        IVar11.value = (pNVar1->index).value;
        if (v_1.values[0] <= t1) {
          uVar4 = pNVar1[1].index.value;
          local_3f4._4_4_ = v_1.values[0];
          uVar12 = uVar4;
          if (v_1.values[0] < fVar26) {
            uVar12 = IVar11.value;
          }
          builder.executor_.thread_pool =
               (ThreadPool *)CONCAT44(builder.executor_.thread_pool._4_4_,uVar12);
          ::bvh::v2::SmallStack<bvh::v2::Index<32UL,_4UL>,_64U>::push
                    (&stack,(Index<32UL,_4UL> *)&builder);
          if ((float)local_3f4._4_4_ < fVar26) {
            IVar11.value = uVar4;
          }
        }
      }
      else {
        if (t1 < v_1.values[0]) goto LAB_00102afb;
        IVar11.value = pNVar1[1].index.value;
      }
    }
    ppfVar20 = (_Map_pointer)((long)pfVar22 * 0x30 + 0x18);
    for (; pPVar10 = precomputed_tris.
                     super__Vector_base<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
        pfVar22 < (_Elt_pointer)(ulong)((IVar11.value & 0xf) + (IVar11.value >> 4));
        pfVar22 = (_Elt_pointer)((long)&(pfVar22->super__Function_base)._M_functor + 1)) {
      auVar31._8_8_ = 0;
      auVar31._0_8_ =
           mini_trees.
           super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = (long)((precomputed_tris.
                      super__Vector_base<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->e1).values + (long)ppfVar20;
      local_340._8_8_ =
           (long)((precomputed_tris.
                   super__Vector_base<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->e2).values + (long)ppfVar20;
      local_3f4._4_8_ =
           (long)((precomputed_tris.
                   super__Vector_base<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->p0).values + (long)ppfVar20;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = *(ulong *)(lVar5 + -0x24);
      auVar32 = vsubps_avx(auVar30,auVar31);
      fVar26 = *(float *)(lVar5 + -0x1c) -
               mini_trees.
               super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish._0_4_;
      auVar24 = vmovshdup_avx(auVar32);
      builder.executor_.thread_pool = (ThreadPool *)vmovlps_avx(auVar32);
      builder.executor_.parallel_threshold =
           CONCAT44(builder.executor_.parallel_threshold._4_4_,fVar26);
      auVar30 = vfmsub231ss_fma(ZEXT416((uint)(auVar24._0_4_ *
                                              mini_trees.
                                              super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                              _4_4_)),
                                ZEXT416((uint)mini_trees.
                                              super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                              _0_4_),ZEXT416((uint)fVar26));
      auVar31 = vfmsub231ss_fma(ZEXT416((uint)(fVar26 * mini_trees.
                                                                                                                
                                                  super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish._4_4_))
                                ,auVar32,ZEXT416((uint)mini_trees.
                                                                                                              
                                                  super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._4_4_));
      auVar32 = vfmsub231ss_fma(ZEXT416((uint)(auVar32._0_4_ *
                                              mini_trees.
                                              super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                              _0_4_)),
                                ZEXT416((uint)mini_trees.
                                              super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish._4_4_),
                                auVar24);
      auVar24 = vinsertps_avx(auVar30,auVar31,0x10);
      v_1.values._0_8_ = vmovlps_avx(auVar24);
      v_1.values[2] = auVar32._0_4_;
      fVar25 = std::
               transform_reduce<float_const*,float_const*,float,std::plus<void>,std::multiplies<void>>
                         (0,lVar5,local_340._8_8_,
                          (undefined1 *)
                          ((long)&mini_trees.
                                  super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + 4));
      fVar25 = 1.0 / fVar25;
      fVar26 = std::
               transform_reduce<float_const*,float_const*,float,std::plus<void>,std::multiplies<void>>
                         (0,&v_1,local_3f4,local_3f4._4_8_);
      local_3f4._4_4_ = fVar26 * fVar25;
      local_340._16_8_ = ppfVar20;
      fVar26 = std::
               transform_reduce<float_const*,float_const*,float,std::plus<void>,std::multiplies<void>>
                         (0,&v_1,local_3f4,(long)pPVar10[-1].n.values + (long)ppfVar20);
      if (((-1.1920929e-07 <= (float)local_3f4._4_4_) &&
          (fVar26 = fVar25 * fVar26, -1.1920929e-07 <= fVar26)) &&
         (-1.1920929e-07 <= (1.0 - (float)local_3f4._4_4_) - fVar26)) {
        fVar27 = std::
                 transform_reduce<float_const*,float_const*,float,std::plus<void>,std::multiplies<void>>
                           (0,lVar5,local_340._8_8_,&builder);
        fVar27 = fVar27 * fVar25;
        if ((fStack_3c0 <= fVar27) && (fVar27 <= (float)local_3bc._0_4_)) {
          builder.executor_.thread_pool = (ThreadPool *)&v;
          builder.executor_.parallel_threshold = (size_t)&u;
          builder.bboxes_._M_ptr = (pointer)local_3bc;
          local_3e8.super__Tuple_impl<0UL,_float,_float,_float>.super__Tuple_impl<1UL,_float,_float>
          .super__Head_base<1UL,_float,_false>._M_head_impl = (float)local_3f4._4_4_;
          local_3e8.super__Tuple_impl<0UL,_float,_float,_float>.super__Tuple_impl<1UL,_float,_float>
          .super__Tuple_impl<2UL,_float>.super__Head_base<2UL,_float,_false>._M_head_impl =
               (_Head_base<2UL,_float,_false>)(_Head_base<2UL,_float,_false>)fVar26;
          uStack_3dc = 1;
          local_3e8.super__Tuple_impl<0UL,_float,_float,_float>.super__Head_base<0UL,_float,_false>.
          _M_head_impl = fVar27;
          std::tuple<float&,float&,float&>::operator=
                    ((tuple<float&,float&,float&> *)&builder,&local_3e8);
          local_340._0_8_ = pfVar22;
        }
      }
      ppfVar20 = (_Map_pointer)(local_340._16_8_ + 0x30);
    }
  } while( true );
}

Assistant:

int main() {
    // This is the original data, which may come in some other data type/structure.
    std::vector<Tri> tris;
    tris.emplace_back(
        Vec3( 1.0, -1.0, 1.0),
        Vec3( 1.0,  1.0, 1.0),
        Vec3(-1.0,  1.0, 1.0)
    );
    tris.emplace_back(
        Vec3( 1.0, -1.0, 1.0),
        Vec3(-1.0, -1.0, 1.0),
        Vec3(-1.0,  1.0, 1.0)
    );

    bvh::v2::ThreadPool thread_pool;
    bvh::v2::ParallelExecutor executor(thread_pool);

    // Get triangle centers and bounding boxes (required for BVH builder)
    std::vector<BBox> bboxes(tris.size());
    std::vector<Vec3> centers(tris.size());
    executor.for_each(0, tris.size(), [&] (size_t begin, size_t end) {
        for (size_t i = begin; i < end; ++i) {
            bboxes[i]  = tris[i].get_bbox();
            centers[i] = tris[i].get_center();
        }
    });

    typename bvh::v2::DefaultBuilder<Node>::Config config;
    config.quality = bvh::v2::DefaultBuilder<Node>::Quality::High;
    auto bvh = bvh::v2::DefaultBuilder<Node>::build(thread_pool, bboxes, centers, config);

    // Permuting the primitive data allows to remove indirections during traversal, which makes it faster.
    static constexpr bool should_permute = true;

    // This precomputes some data to speed up traversal further.
    std::vector<PrecomputedTri> precomputed_tris(tris.size());
    executor.for_each(0, tris.size(), [&] (size_t begin, size_t end) {
        for (size_t i = begin; i < end; ++i) {
            auto j = should_permute ? bvh.prim_ids[i] : i;
            precomputed_tris[i] = tris[j];
        }
    });

    auto ray = Ray {
        Vec3(0., 0., 0.), // Ray origin
        Vec3(0., 0., 1.), // Ray direction
        0.,               // Minimum intersection distance
        100.              // Maximum intersection distance
    };

    static constexpr size_t invalid_id = std::numeric_limits<size_t>::max();
    static constexpr size_t stack_size = 64;
    static constexpr bool use_robust_traversal = false;

    auto prim_id = invalid_id;
    Scalar u, v;

    // Traverse the BVH and get the u, v coordinates of the closest intersection.
    bvh::v2::SmallStack<Bvh::Index, stack_size> stack;
    bvh.intersect<false, use_robust_traversal>(ray, bvh.get_root().index, stack,
        [&] (size_t begin, size_t end) {
            for (size_t i = begin; i < end; ++i) {
                size_t j = should_permute ? i : bvh.prim_ids[i];
                if (auto hit = precomputed_tris[j].intersect(ray)) {
                    prim_id = i;
                    std::tie(ray.tmax, u, v) = *hit;
                }
            }
            return prim_id != invalid_id;
        });

    if (prim_id != invalid_id) {
        std::cout
            << "Intersection found\n"
            << "  primitive: " << prim_id << "\n"
            << "  distance: " << ray.tmax << "\n"
            << "  barycentric coords.: " << u << ", " << v << std::endl;
        return 0;
    } else {
        std::cout << "No intersection found" << std::endl;
        return 1;
    }
}